

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

void ZSTD_buildFSETable_body_bmi2
               (ZSTD_seqSymbol *dt,short *normalizedCounter,uint maxSymbolValue,U32 *baseValue,
               U8 *nbAdditionalBits,uint tableLog,void *wksp,size_t wkspSize)

{
  short sVar1;
  sbyte sVar2;
  ushort uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  size_t u;
  long lVar13;
  int iVar14;
  undefined4 uVar15;
  uint uVar16;
  long lVar17;
  
  if (0x34 < maxSymbolValue) {
    __assert_fail("maxSymbolValue <= MaxSeq",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0xa655,
                  "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                 );
  }
  if (9 < tableLog) {
    __assert_fail("tableLog <= MaxFSELog",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0xa656,
                  "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                 );
  }
  if (wkspSize < 0x272) {
    __assert_fail("wkspSize >= ZSTD_BUILD_FSE_TABLE_WKSP_SIZE",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0xa657,
                  "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                 );
  }
  uVar6 = maxSymbolValue + 1;
  uVar15 = 1;
  uVar4 = 1 << (tableLog & 0x1f);
  lVar11 = (long)wksp + 0x6a;
  sVar2 = ((byte)tableLog < 0x21) * (' ' - (byte)tableLog);
  uVar7 = (uint)(-1 << sVar2) >> sVar2;
  uVar12 = (uint)(0x8000 << (tableLog & 0x1f)) >> 0x10;
  uVar8 = uVar7;
  for (uVar10 = 0; uVar6 != uVar10; uVar10 = uVar10 + 1) {
    uVar3 = normalizedCounter[uVar10];
    if (uVar3 == 0xffff) {
      uVar5 = (ulong)uVar8;
      uVar8 = uVar8 - 1;
      dt[uVar5 + 1].baseValue = (U32)uVar10;
      uVar3 = 1;
    }
    else {
      if ((short)uVar3 < 0) {
        __assert_fail("normalizedCounter[s]>=0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0xa665,
                      "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                     );
      }
      if (uVar12 < uVar3 || uVar12 == uVar3) {
        uVar15 = 0;
      }
    }
    *(ushort *)((long)wksp + uVar10 * 2) = uVar3;
  }
  dt->nextState = (short)uVar15;
  dt->nbAdditionalBits = (char)((uint)uVar15 >> 0x10);
  dt->nbBits = (char)((uint)uVar15 >> 0x18);
  dt->baseValue = tableLog;
  if (uVar8 == uVar7) {
    iVar14 = (uVar4 >> 3) + (uVar4 >> 1) + 3;
    lVar13 = 0;
    lVar9 = 0;
    for (uVar8 = 0; uVar8 != uVar6; uVar8 = uVar8 + 1) {
      sVar1 = normalizedCounter[uVar8];
      *(long *)((long)wksp + lVar9 + 0x6a) = lVar13;
      for (lVar17 = 0x72; lVar17 + -0x6a < (long)sVar1; lVar17 = lVar17 + 8) {
        *(long *)((long)wksp + lVar17 + lVar9) = lVar13;
      }
      if (sVar1 < 0) {
        __assert_fail("n>=0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0xa687,
                      "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                     );
      }
      lVar9 = lVar9 + sVar1;
      lVar13 = lVar13 + 0x101010101010101;
    }
    if ((uVar4 & 1) != 0) {
      __assert_fail("tableSize % unroll == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xa695,
                    "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                   );
    }
    uVar8 = 0;
    for (uVar10 = 0; uVar10 < uVar4; uVar10 = uVar10 + 2) {
      uVar6 = uVar8;
      for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
        dt[(ulong)(uVar6 & uVar7) + 1].baseValue = (uint)*(byte *)(lVar11 + lVar9);
        uVar6 = uVar6 + iVar14;
      }
      uVar8 = uVar8 + iVar14 * 2 & uVar7;
      lVar11 = lVar11 + 2;
    }
    if (uVar8 != 0) {
      __assert_fail("position == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xa69e,
                    "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                   );
    }
  }
  else {
    uVar5 = 0;
    for (uVar10 = 0; uVar10 != uVar6; uVar10 = uVar10 + 1) {
      uVar3 = normalizedCounter[uVar10];
      uVar12 = 0;
      if ((short)uVar3 < 1) {
        uVar3 = 0;
      }
      for (; uVar12 != uVar3; uVar12 = uVar12 + 1) {
        dt[uVar5 + 1].baseValue = (U32)uVar10;
        do {
          uVar16 = (int)uVar5 + (uVar4 >> 3) + (uVar4 >> 1) + 3 & uVar7;
          uVar5 = (ulong)uVar16;
        } while (uVar8 < uVar16);
      }
    }
    if ((int)uVar5 != 0) {
      __assert_fail("position == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xa6ac,
                    "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                   );
    }
  }
  uVar10 = 0;
  while( true ) {
    if (uVar4 == uVar10) {
      return;
    }
    uVar5 = (ulong)dt[uVar10 + 1].baseValue;
    uVar3 = *(ushort *)((long)wksp + uVar5 * 2);
    *(ushort *)((long)wksp + uVar5 * 2) = uVar3 + 1;
    iVar14 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar14 == 0; iVar14 = iVar14 + -1) {
      }
    }
    dt[uVar10 + 1].nbBits = (BYTE)(tableLog - iVar14);
    dt[uVar10 + 1].nextState = (uVar3 << (tableLog - iVar14 & 0x1f)) - (short)uVar4;
    if (nbAdditionalBits[uVar5] == 0xff) break;
    dt[uVar10 + 1].nbAdditionalBits = nbAdditionalBits[uVar5];
    dt[uVar10 + 1].baseValue = baseValue[uVar5];
    uVar10 = uVar10 + 1;
  }
  __assert_fail("nbAdditionalBits[symbol] < 255",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0xa6b7,
                "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
               );
}

Assistant:

FORCE_INLINE_TEMPLATE
void ZSTD_buildFSETable_body(ZSTD_seqSymbol* dt,
            const short* normalizedCounter, unsigned maxSymbolValue,
            const U32* baseValue, const U8* nbAdditionalBits,
            unsigned tableLog, void* wksp, size_t wkspSize)
{
    ZSTD_seqSymbol* const tableDecode = dt+1;
    U32 const maxSV1 = maxSymbolValue + 1;
    U32 const tableSize = 1 << tableLog;

    U16* symbolNext = (U16*)wksp;
    BYTE* spread = (BYTE*)(symbolNext + MaxSeq + 1);
    U32 highThreshold = tableSize - 1;


    /* Sanity Checks */
    assert(maxSymbolValue <= MaxSeq);
    assert(tableLog <= MaxFSELog);
    assert(wkspSize >= ZSTD_BUILD_FSE_TABLE_WKSP_SIZE);
    (void)wkspSize;
    /* Init, lay down lowprob symbols */
    {   ZSTD_seqSymbol_header DTableH;
        DTableH.tableLog = tableLog;
        DTableH.fastMode = 1;
        {   S16 const largeLimit= (S16)(1 << (tableLog-1));
            U32 s;
            for (s=0; s<maxSV1; s++) {
                if (normalizedCounter[s]==-1) {
                    tableDecode[highThreshold--].baseValue = s;
                    symbolNext[s] = 1;
                } else {
                    if (normalizedCounter[s] >= largeLimit) DTableH.fastMode=0;
                    assert(normalizedCounter[s]>=0);
                    symbolNext[s] = (U16)normalizedCounter[s];
        }   }   }
        ZSTD_memcpy(dt, &DTableH, sizeof(DTableH));
    }

    /* Spread symbols */
    assert(tableSize <= 512);
    /* Specialized symbol spreading for the case when there are
     * no low probability (-1 count) symbols. When compressing
     * small blocks we avoid low probability symbols to hit this
     * case, since header decoding speed matters more.
     */
    if (highThreshold == tableSize - 1) {
        size_t const tableMask = tableSize-1;
        size_t const step = FSE_TABLESTEP(tableSize);
        /* First lay down the symbols in order.
         * We use a uint64_t to lay down 8 bytes at a time. This reduces branch
         * misses since small blocks generally have small table logs, so nearly
         * all symbols have counts <= 8. We ensure we have 8 bytes at the end of
         * our buffer to handle the over-write.
         */
        {
            U64 const add = 0x0101010101010101ull;
            size_t pos = 0;
            U64 sv = 0;
            U32 s;
            for (s=0; s<maxSV1; ++s, sv += add) {
                int i;
                int const n = normalizedCounter[s];
                MEM_write64(spread + pos, sv);
                for (i = 8; i < n; i += 8) {
                    MEM_write64(spread + pos + i, sv);
                }
                assert(n>=0);
                pos += (size_t)n;
            }
        }
        /* Now we spread those positions across the table.
         * The benefit of doing it in two stages is that we avoid the
         * variable size inner loop, which caused lots of branch misses.
         * Now we can run through all the positions without any branch misses.
         * We unroll the loop twice, since that is what empirically worked best.
         */
        {
            size_t position = 0;
            size_t s;
            size_t const unroll = 2;
            assert(tableSize % unroll == 0); /* FSE_MIN_TABLELOG is 5 */
            for (s = 0; s < (size_t)tableSize; s += unroll) {
                size_t u;
                for (u = 0; u < unroll; ++u) {
                    size_t const uPosition = (position + (u * step)) & tableMask;
                    tableDecode[uPosition].baseValue = spread[s + u];
                }
                position = (position + (unroll * step)) & tableMask;
            }
            assert(position == 0);
        }
    } else {
        U32 const tableMask = tableSize-1;
        U32 const step = FSE_TABLESTEP(tableSize);
        U32 s, position = 0;
        for (s=0; s<maxSV1; s++) {
            int i;
            int const n = normalizedCounter[s];
            for (i=0; i<n; i++) {
                tableDecode[position].baseValue = s;
                position = (position + step) & tableMask;
                while (UNLIKELY(position > highThreshold)) position = (position + step) & tableMask;   /* lowprob area */
        }   }
        assert(position == 0); /* position must reach all cells once, otherwise normalizedCounter is incorrect */
    }

    /* Build Decoding table */
    {
        U32 u;
        for (u=0; u<tableSize; u++) {
            U32 const symbol = tableDecode[u].baseValue;
            U32 const nextState = symbolNext[symbol]++;
            tableDecode[u].nbBits = (BYTE) (tableLog - ZSTD_highbit32(nextState) );
            tableDecode[u].nextState = (U16) ( (nextState << tableDecode[u].nbBits) - tableSize);
            assert(nbAdditionalBits[symbol] < 255);
            tableDecode[u].nbAdditionalBits = nbAdditionalBits[symbol];
            tableDecode[u].baseValue = baseValue[symbol];
        }
    }
}